

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

void * mmap_probe(PRNGState *rs,size_t size)

{
  long lVar1;
  int iVar2;
  uintptr_t uVar3;
  int *piVar4;
  void *__addr;
  uint64_t uVar5;
  uint uVar6;
  
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  for (uVar6 = 0; uVar6 != 0x1e; uVar6 = uVar6 + 1) {
    __addr = mmap64((void *)mmap_probe::hint_addr,size,3,0x22,-1,0);
    uVar3 = (long)__addr + size;
    if (((void *)0x3fff < __addr && __addr < (void *)0x800000000000) &&
        (long)__addr + size < 0x800000000000) goto LAB_0011b9ef;
    if (__addr == (void *)0xffffffffffffffff) {
      if (*piVar4 == 0xc) {
        return (void *)0xffffffffffffffff;
      }
    }
    else {
      munmap(__addr,size);
    }
    if (mmap_probe::hint_addr == 0) {
LAB_0011b9c1:
      do {
        uVar5 = lj_prng_u64(rs);
        mmap_probe::hint_addr = uVar5 & 0x7ffffffff000;
      } while (mmap_probe::hint_addr < 0x4000);
    }
    else if (uVar6 < 5) {
      lVar1 = mmap_probe::hint_addr + size;
      mmap_probe::hint_addr = mmap_probe::hint_addr + 0x1000000;
      if (0x7fffffffffff < lVar1 + 0x1000000U) {
        mmap_probe::hint_addr = 0;
      }
    }
    else {
      if (uVar6 != 5) goto LAB_0011b9c1;
      mmap_probe::hint_addr = 0;
    }
  }
  __addr = (void *)0xffffffffffffffff;
  uVar3 = mmap_probe::hint_addr;
LAB_0011b9ef:
  mmap_probe::hint_addr = uVar3;
  *piVar4 = iVar2;
  return __addr;
}

Assistant:

static void *mmap_probe(PRNGState *rs, size_t size)
{
  /* Hint for next allocation. Doesn't need to be thread-safe. */
  static uintptr_t hint_addr = 0;
  int olderr = errno;
  int retry;
  for (retry = 0; retry < LJ_ALLOC_MMAP_PROBE_MAX; retry++) {
    void *p = mmap((void *)hint_addr, size, MMAP_PROT, MMAP_FLAGS_PROBE, -1, 0);
    uintptr_t addr = (uintptr_t)p;
    if ((addr >> LJ_ALLOC_MBITS) == 0 && addr >= LJ_ALLOC_MMAP_PROBE_LOWER &&
	((addr + size) >> LJ_ALLOC_MBITS) == 0) {
      /* We got a suitable address. Bump the hint address. */
      hint_addr = addr + size;
      errno = olderr;
      return p;
    }
    if (p != MFAIL) {
      munmap(p, size);
    } else if (errno == ENOMEM) {
      return MFAIL;
    }
    if (hint_addr) {
      /* First, try linear probing. */
      if (retry < LJ_ALLOC_MMAP_PROBE_LINEAR) {
	hint_addr += 0x1000000;
	if (((hint_addr + size) >> LJ_ALLOC_MBITS) != 0)
	  hint_addr = 0;
	continue;
      } else if (retry == LJ_ALLOC_MMAP_PROBE_LINEAR) {
	/* Next, try a no-hint probe to get back an ASLR address. */
	hint_addr = 0;
	continue;
      }
    }
    /* Finally, try pseudo-random probing. */
    do {
      hint_addr = lj_prng_u64(rs) & (((uintptr_t)1<<LJ_ALLOC_MBITS)-LJ_PAGESIZE);
    } while (hint_addr < LJ_ALLOC_MMAP_PROBE_LOWER);
  }
  errno = olderr;
  return MFAIL;
}